

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O1

int Fra_ClausProcessClauses2(Clu_Man_t *p,int fRefs)

{
  void *pvVar1;
  Aig_Man_t *pAVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  Fra_Sml_t *pSeq;
  Fra_Sml_t *pSimMan;
  Aig_ManCut_t *p_00;
  Vec_Ptr_t *pVVar6;
  sat_solver *psVar7;
  Vec_Int_t *pVVar8;
  long lVar9;
  long lVar10;
  char *__s;
  int iVar11;
  long lVar12;
  Aig_Cut_t *pCut;
  timespec ts_5;
  int ScoresSeq [4096];
  int ScoresComb [4096];
  uint local_805c;
  long local_8058;
  timespec local_8048;
  timespec local_8038 [1024];
  int local_4038 [4098];
  
  if (0xc < p->nLutSize) {
    __assert_fail("p->nLutSize < 13",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClaus.c"
                  ,0x2de,"int Fra_ClausProcessClauses2(Clu_Man_t *, int)");
  }
  clock_gettime(3,local_8038);
  Aig_ManRandom(1);
  pSeq = Fra_SmlSimulateSeq(p->pAig,0,p->nPref + p->nSimFrames,p->nSimWords / p->nSimFrames,1);
  if ((p->fTarget == 0) || (pSeq->fNonConstOut == 0)) {
    clock_gettime(3,local_8038);
    Aig_ManRandom(1);
    pSimMan = Fra_SmlSimulateComb(p->pAig,p->nSimWordsPref + p->nSimWords,0);
    clock_gettime(3,local_8038);
    if (fRefs != 0) {
      Fra_ClausCollectLatchClauses(p,pSeq);
    }
    clock_gettime(3,local_8038);
    local_805c = 0;
    p_00 = Aig_ComputeCuts(p->pAig,p->nCutsMax,p->nLutSize,0,p->fVerbose);
    iVar4 = clock_gettime(3,local_8038);
    if (iVar4 < 0) {
      local_8058 = 1;
    }
    else {
      lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_8038[0].tv_nsec),8);
      local_8058 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_8038[0].tv_sec * -1000000;
    }
    pVVar6 = p->pAig->vObjs;
    if (0 < pVVar6->nSize) {
      lVar10 = 0;
      local_805c = 0;
      do {
        pvVar1 = pVVar6->pArray[lVar10];
        if ((((pvVar1 != (void *)0x0) &&
             (0xfffffffd < ((uint)*(undefined8 *)((long)pvVar1 + 0x18) & 7) - 7)) &&
            (((uint)((ulong)*(undefined8 *)((long)pvVar1 + 0x18) >> 0x20) & 0xffffff) <=
             (uint)p->nLevels)) && (0 < p_00->nCutsMax)) {
          pCut = p_00->pCuts[*(int *)((long)pvVar1 + 0x24)];
          iVar4 = 0;
          do {
            if ('\x01' < pCut->nFanins) {
              local_805c = local_805c + 1;
              Fra_ClausProcessClausesCut3(p,pSeq,pCut,(int *)local_8038);
              Fra_ClausProcessClausesCut3(p,pSimMan,pCut,local_4038);
              if (pCut->nFanins != '\x1f') {
                lVar12 = 0;
                do {
                  if ((local_4038[lVar12] != 0) &&
                     (*(int *)((long)&local_8038[0].tv_sec + lVar12 * 4) == 0)) {
                    Fra_ClausRecordClause2(p,pCut,(int)lVar12,local_4038[lVar12]);
                  }
                  lVar12 = lVar12 + 1;
                } while (lVar12 < 1 << (pCut->nFanins & 0x1fU));
              }
            }
            iVar4 = iVar4 + 1;
            pCut = (Aig_Cut_t *)((long)&pCut->pNext + (long)pCut->nCutSize);
          } while (iVar4 < p_00->nCutsMax);
        }
        lVar10 = lVar10 + 1;
        pVVar6 = p->pAig->vObjs;
      } while (lVar10 < pVVar6->nSize);
    }
    Fra_SmlStop(pSeq);
    Fra_SmlStop(pSimMan);
    p->nCuts = local_805c;
    Aig_ManCutStop(p_00);
    pAVar2 = p->pAig;
    pAVar2->pManCuts = (void *)0x0;
    if (p->fVerbose != 0) {
      iVar4 = 0x9609d2;
      printf("Node = %5d. Cuts = %7d. Clauses = %6d. Clause/cut = %6.2f.\n",
             (double)p->vClauses->nSize / (double)(int)local_805c,
             (ulong)(uint)(pAVar2->nObjs[6] + pAVar2->nObjs[5]),(ulong)local_805c);
      Abc_Print(iVar4,"%s =","Processing sim-info to find candidate clauses (unoptimized)");
      iVar5 = 3;
      iVar4 = clock_gettime(3,&local_8048);
      if (iVar4 < 0) {
        lVar10 = -1;
      }
      else {
        lVar10 = local_8048.tv_nsec / 1000 + local_8048.tv_sec * 1000000;
      }
      Abc_Print(iVar5,"%9.2f sec\n",(double)(lVar10 + local_8058) / 1000000.0);
    }
    if (p->nClauses != 0) {
      __assert_fail("p->nClauses == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClaus.c"
                    ,0x331,"int Fra_ClausProcessClauses2(Clu_Man_t *, int)");
    }
    p->nClauses = p->vClauses->nSize;
    if (0 < p->vClausesProven->nSize) {
      if (p->pSatMain != (sat_solver *)0x0) {
        sat_solver_delete(p->pSatMain);
      }
      psVar7 = (sat_solver *)Cnf_DataWriteIntoSolver(p->pCnf,1,0);
      p->pSatMain = psVar7;
      if (psVar7 == (sat_solver *)0x0) {
        __s = "Error: Main solver is unsat.";
LAB_005f5c27:
        puts(__s);
        return -1;
      }
      pVVar8 = p->vClausesProven;
      if (pVVar8->nSize < 1) {
        iVar4 = -1;
      }
      else {
        piVar3 = p->vLitsProven->pArray;
        lVar10 = 0;
        iVar5 = 0;
        do {
          iVar4 = pVVar8->pArray[lVar10];
          if (p->nLutSize < iVar4 - iVar5) {
            __assert_fail("End - Beg <= p->nLutSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClaus.c"
                          ,0x346,"int Fra_ClausProcessClauses2(Clu_Man_t *, int)");
          }
          iVar5 = sat_solver_addclause(p->pSatMain,piVar3 + iVar5,piVar3 + iVar4);
          if (iVar5 == 0) {
            __s = "Error: Solver is UNSAT after adding assumption clauses.";
            goto LAB_005f5c27;
          }
          lVar10 = lVar10 + 1;
          pVVar8 = p->vClausesProven;
          iVar5 = iVar4;
        } while (lVar10 < pVVar8->nSize);
      }
      if (iVar4 != p->vLitsProven->nSize) {
        __assert_fail("End == Vec_IntSize(p->vLitsProven)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClaus.c"
                      ,0x350,"int Fra_ClausProcessClauses2(Clu_Man_t *, int)");
      }
      pVVar8 = p->vClauses;
      iVar5 = pVVar8->nSize;
      if (0 < iVar5) {
        piVar3 = p->vLits->pArray;
        lVar10 = 0;
        iVar11 = 0;
        do {
          if (p->vCosts->nSize <= lVar10) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          if (p->vCosts->pArray[lVar10] < 0) {
            __assert_fail("Vec_IntEntry( p->vCosts, i ) >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClaus.c"
                          ,0x357,"int Fra_ClausProcessClauses2(Clu_Man_t *, int)");
          }
          iVar4 = pVVar8->pArray[lVar10];
          if (p->nLutSize < iVar4 - iVar11) {
            __assert_fail("End - Beg <= p->nLutSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClaus.c"
                          ,0x358,"int Fra_ClausProcessClauses2(Clu_Man_t *, int)");
          }
          lVar12 = (long)iVar4;
          if (iVar11 < iVar4) {
            lVar9 = (long)iVar11;
            do {
              *(byte *)(piVar3 + lVar9) = *(byte *)(piVar3 + lVar9) ^ 1;
              lVar9 = lVar9 + 1;
            } while (lVar12 != lVar9);
          }
          lVar9 = (long)iVar11;
          iVar5 = sat_solver_solve(p->pSatMain,piVar3 + lVar9,piVar3 + lVar12,(long)p->nBTLimit,0,0,
                                   0);
          if (iVar11 < iVar4) {
            do {
              *(byte *)(piVar3 + lVar9) = *(byte *)(piVar3 + lVar9) ^ 1;
              lVar9 = lVar9 + 1;
            } while (lVar12 != lVar9);
          }
          if (iVar5 == -1) {
            if (p->vCosts->nSize <= lVar10) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            p->vCosts->pArray[lVar10] = -1;
            p->nClauses = p->nClauses + -1;
          }
          lVar10 = lVar10 + 1;
          pVVar8 = p->vClauses;
          iVar5 = pVVar8->nSize;
          iVar11 = iVar4;
        } while (lVar10 < iVar5);
      }
      if (iVar4 != p->vLits->nSize) {
        __assert_fail("End == Vec_IntSize(p->vLits)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClaus.c"
                      ,0x367,"int Fra_ClausProcessClauses2(Clu_Man_t *, int)");
      }
      if (p->fVerbose != 0) {
        printf("Already proved clauses filtered out %d candidate clauses (out of %d).\n",
               (ulong)(uint)(iVar5 - p->nClauses));
      }
    }
    p->fFiltering = 0;
    iVar4 = 1;
    if (p->nClausesMax < p->nClauses) {
      Fra_ClausSelectClauses(p);
      p->fFiltering = 1;
    }
  }
  else {
    puts("Property failed after sequential simulation!");
    Fra_SmlStop(pSeq);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int Fra_ClausProcessClauses2( Clu_Man_t * p, int fRefs )
{
//    Aig_MmFixed_t * pMemCuts;
    Aig_ManCut_t * pManCut;
    Fra_Sml_t * pComb, * pSeq;
    Aig_Obj_t * pObj;
    Aig_Cut_t * pCut;
    int i, k, j, nCuts = 0;
    abctime clk;
    int ScoresSeq[1<<12], ScoresComb[1<<12];
    assert( p->nLutSize < 13 );

    // simulate the AIG
clk = Abc_Clock();
//    srand( 0xAABBAABB );
    Aig_ManRandom(1);
    pSeq = Fra_SmlSimulateSeq( p->pAig, 0, p->nPref + p->nSimFrames, p->nSimWords/p->nSimFrames, 1  );
    if ( p->fTarget && pSeq->fNonConstOut )
    {
        printf( "Property failed after sequential simulation!\n" );
        Fra_SmlStop( pSeq );
        return 0;
    }
if ( p->fVerbose )
{
//ABC_PRT( "Sim-seq", Abc_Clock() - clk );
}

    // perform combinational simulation
clk = Abc_Clock();
//    srand( 0xAABBAABB );
    Aig_ManRandom(1);
    pComb = Fra_SmlSimulateComb( p->pAig, p->nSimWords + p->nSimWordsPref, 0 );
if ( p->fVerbose )
{
//ABC_PRT( "Sim-cmb", Abc_Clock() - clk );
}


clk = Abc_Clock();
    if ( fRefs )
    {
    Fra_ClausCollectLatchClauses( p, pSeq );
if ( p->fVerbose )
{
//ABC_PRT( "Lat-cla", Abc_Clock() - clk );
}
    }


    // generate cuts for all nodes, assign cost, and find best cuts
clk = Abc_Clock();
//    pMemCuts = Dar_ManComputeCuts( p->pAig, 10, 0, 1 );
    pManCut = Aig_ComputeCuts( p->pAig, p->nCutsMax, p->nLutSize, 0, p->fVerbose );
if ( p->fVerbose )
{
//ABC_PRT( "Cuts   ", Abc_Clock() - clk );
}

    // collect combinational info for each cut
clk = Abc_Clock();
    Aig_ManForEachNode( p->pAig, pObj, i )
    {
        if ( pObj->Level > (unsigned)p->nLevels )
            continue;
        Aig_ObjForEachCut( pManCut, pObj, pCut, k )
            if ( pCut->nFanins > 1 )
            {
                nCuts++;
                Fra_ClausProcessClausesCut3( p, pSeq, pCut, ScoresSeq );
                Fra_ClausProcessClausesCut3( p, pComb, pCut, ScoresComb );
                // write the clauses
                for ( j = 0; j < (1<<pCut->nFanins); j++ )
                    if ( ScoresComb[j] != 0 && ScoresSeq[j] == 0 )
                        Fra_ClausRecordClause2( p, pCut, j, ScoresComb[j] );

            }
    }
    Fra_SmlStop( pSeq );
    Fra_SmlStop( pComb );
    p->nCuts = nCuts;
//    Aig_MmFixedStop( pMemCuts, 0 );
    Aig_ManCutStop( pManCut );
    p->pAig->pManCuts = NULL;

    if ( p->fVerbose )
    {
    printf( "Node = %5d. Cuts = %7d. Clauses = %6d. Clause/cut = %6.2f.\n", 
        Aig_ManNodeNum(p->pAig), nCuts, Vec_IntSize(p->vClauses), 1.0*Vec_IntSize(p->vClauses)/nCuts );
    ABC_PRT( "Processing sim-info to find candidate clauses (unoptimized)", Abc_Clock() - clk );
    }

    // filter out clauses that are contained in the already proven clauses
    assert( p->nClauses == 0 );
    p->nClauses = Vec_IntSize( p->vClauses );
    if ( Vec_IntSize( p->vClausesProven ) > 0 )
    {
        int RetValue, k, Beg;
        int End = -1; // Suppress "might be used uninitialized"
        int * pStart;
        // reset the solver
        if ( p->pSatMain )  sat_solver_delete( p->pSatMain );
        p->pSatMain = (sat_solver *)Cnf_DataWriteIntoSolver( p->pCnf, 1, 0 );
        if ( p->pSatMain == NULL )
        {
            printf( "Error: Main solver is unsat.\n" );
            return -1;
        }  

        // add the proven clauses
        Beg = 0;
        pStart = Vec_IntArray(p->vLitsProven);
        Vec_IntForEachEntry( p->vClausesProven, End, i )
        {
            assert( End - Beg <= p->nLutSize );
            // add the clause to all timeframes
            RetValue = sat_solver_addclause( p->pSatMain, pStart + Beg, pStart + End );
            if ( RetValue == 0 )
            {
                printf( "Error: Solver is UNSAT after adding assumption clauses.\n" );
                return -1;
            }
            Beg = End;
        }
        assert( End == Vec_IntSize(p->vLitsProven) );

        // check the clauses
        Beg = 0;
        pStart = Vec_IntArray(p->vLits);
        Vec_IntForEachEntry( p->vClauses, End, i )
        {
            assert( Vec_IntEntry( p->vCosts, i ) >= 0 );
            assert( End - Beg <= p->nLutSize );
            // check the clause
            for ( k = Beg; k < End; k++ )
                pStart[k] = lit_neg( pStart[k] );
            RetValue = sat_solver_solve( p->pSatMain, pStart + Beg, pStart + End, (ABC_INT64_T)p->nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
            for ( k = Beg; k < End; k++ )
                pStart[k] = lit_neg( pStart[k] );
            // the clause holds
            if ( RetValue == l_False )
            {
                Vec_IntWriteEntry( p->vCosts, i, -1 );
                p->nClauses--;
            }
            Beg = End;
        }
        assert( End == Vec_IntSize(p->vLits) );
        if ( p->fVerbose )
        printf( "Already proved clauses filtered out %d candidate clauses (out of %d).\n", 
            Vec_IntSize(p->vClauses) - p->nClauses, Vec_IntSize(p->vClauses) );
    }

    p->fFiltering = 0;
    if ( p->nClauses > p->nClausesMax )
    {
        Fra_ClausSelectClauses( p );
        p->fFiltering = 1;
    }
    return 1;
}